

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::ObjFileParser(ObjFileParser *this)

{
  ObjFileParser *this_local;
  
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::__normal_iterator
            (&this->m_DataIt);
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::__normal_iterator
            (&this->m_DataItEnd);
  std::unique_ptr<Assimp::ObjFile::Model,std::default_delete<Assimp::ObjFile::Model>>::
  unique_ptr<std::default_delete<Assimp::ObjFile::Model>,void>
            ((unique_ptr<Assimp::ObjFile::Model,std::default_delete<Assimp::ObjFile::Model>> *)
             &this->m_pModel,(nullptr_t)0x0);
  this->m_uiLine = 0;
  this->m_pIO = (IOSystem *)0x0;
  this->m_progress = (ProgressHandler *)0x0;
  std::__cxx11::string::string((string *)&this->m_originalObjFileName);
  return;
}

Assistant:

ObjFileParser::ObjFileParser()
: m_DataIt()
, m_DataItEnd()
, m_pModel( nullptr )
, m_uiLine( 0 )
, m_pIO( nullptr )
, m_progress( nullptr )
, m_originalObjFileName() {
    // empty
}